

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void check_io(CPUX86State *env,int addr,int size,uintptr_t retaddr)

{
  target_ulong tVar1;
  int iVar2;
  uint32_t uVar3;
  
  if ((((env->tr).flags & 0x8f00) == 0x8900) && (0x66 < (env->tr).limit)) {
    tVar1 = (env->tr).base;
    iVar2 = cpu_mmu_index_kernel(env);
    uVar3 = cpu_lduw_mmuidx_ra_x86_64(env,tVar1 + 0x66,iVar2,retaddr);
    if (uVar3 + (addr >> 3) + 1 <= (env->tr).limit) {
      tVar1 = (env->tr).base;
      iVar2 = cpu_mmu_index_kernel(env);
      uVar3 = cpu_lduw_mmuidx_ra_x86_64(env,(long)(int)(uVar3 + (addr >> 3)) + tVar1,iVar2,retaddr);
      if (((int)uVar3 >> ((byte)addr & 7) & ~(-1 << ((byte)size & 0x1f))) == 0) {
        return;
      }
    }
  }
  raise_exception_err_ra_x86_64(env,0xd,0,retaddr);
}

Assistant:

static inline void check_io(CPUX86State *env, int addr, int size,
                            uintptr_t retaddr)
{
    int io_offset, val, mask;

    /* TSS must be a valid 32 bit one */
    if (!(env->tr.flags & DESC_P_MASK) ||
        ((env->tr.flags >> DESC_TYPE_SHIFT) & 0xf) != 9 ||
        env->tr.limit < 103) {
        goto fail;
    }
    io_offset = cpu_lduw_kernel_ra(env, env->tr.base + 0x66, retaddr);
    io_offset += (addr >> 3);
    /* Note: the check needs two bytes */
    if ((io_offset + 1) > env->tr.limit) {
        goto fail;
    }
    val = cpu_lduw_kernel_ra(env, env->tr.base + io_offset, retaddr);
    val >>= (addr & 7);
    mask = (1 << size) - 1;
    /* all bits must be zero to allow the I/O */
    if ((val & mask) != 0) {
    fail:
        raise_exception_err_ra(env, EXCP0D_GPF, 0, retaddr);
    }
}